

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall SimpleLoggerMgr::addLogger(SimpleLoggerMgr *this,SimpleLogger *logger)

{
  __hashtable *__h;
  unique_lock<std::mutex> l;
  __node_gen_type __node_gen;
  unique_lock<std::mutex> local_38;
  SimpleLogger *local_28;
  unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
  *local_20;
  
  local_38._M_owns = false;
  local_38._M_device = &this->loggersLock;
  local_28 = logger;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  local_20 = &this->loggers;
  std::
  _Hashtable<SimpleLogger*,SimpleLogger*,std::allocator<SimpleLogger*>,std::__detail::_Identity,std::equal_to<SimpleLogger*>,std::hash<SimpleLogger*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<SimpleLogger*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<SimpleLogger*,false>>>>
            ((_Hashtable<SimpleLogger*,SimpleLogger*,std::allocator<SimpleLogger*>,std::__detail::_Identity,std::equal_to<SimpleLogger*>,std::hash<SimpleLogger*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_20,&local_28);
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void SimpleLoggerMgr::addLogger(SimpleLogger* logger) {
    std::unique_lock<std::mutex> l(loggersLock);
    loggers.insert(logger);
}